

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineParser.cpp
# Opt level: O2

void __thiscall CommandLineParser::readNonOptionCommands(CommandLineParser *this)

{
  bool bVar1;
  int iVar2;
  string *this_00;
  string local_d0;
  string parameters;
  CommandLinePlugInInfo plugIn;
  string local_40;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&plugIn,":",(allocator<char> *)&local_d0);
  bVar1 = argumentStartsWith(this,&plugIn.m_fileName);
  std::__cxx11::string::~string((string *)&plugIn);
  if (bVar1) {
    getNextArgument_abi_cxx11_(&local_d0,this);
    std::__cxx11::string::substr((ulong)&plugIn,(ulong)&local_d0);
    std::__cxx11::string::operator=((string *)&this->m_testPath,(string *)&plugIn);
    std::__cxx11::string::~string((string *)&plugIn);
    std::__cxx11::string::~string((string *)&local_d0);
  }
  else {
    CommandLinePlugInInfo::CommandLinePlugInInfo(&plugIn);
    getCurrentArgument_abi_cxx11_(&local_d0,this);
    iVar2 = std::__cxx11::string::find((char)&local_d0,0x3d);
    std::__cxx11::string::~string((string *)&local_d0);
    if (iVar2 < 0) {
      getCurrentArgument_abi_cxx11_(&local_d0,this);
      this_00 = &local_d0;
      std::__cxx11::string::operator=((string *)&plugIn,(string *)this_00);
    }
    else {
      getCurrentArgument_abi_cxx11_(&parameters,this);
      std::__cxx11::string::substr((ulong)&local_d0,(ulong)&parameters);
      std::__cxx11::string::operator=((string *)&plugIn,(string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&parameters);
      getCurrentArgument_abi_cxx11_(&local_d0,this);
      std::__cxx11::string::substr((ulong)&parameters,(ulong)&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      CppUnit::PlugInParameters::PlugInParameters
                ((PlugInParameters *)&local_d0,(string *)&parameters);
      std::__cxx11::string::_M_assign((string *)&plugIn.field_0x28);
      CppUnit::PlugInParameters::~PlugInParameters((PlugInParameters *)&local_d0);
      this_00 = &parameters;
    }
    std::__cxx11::string::~string((string *)this_00);
    std::deque<CommandLinePlugInInfo,_std::allocator<CommandLinePlugInInfo>_>::push_back
              (&this->m_plugIns,&plugIn);
    getNextArgument_abi_cxx11_(&local_40,this);
    std::__cxx11::string::~string((string *)&local_40);
    CommandLinePlugInInfo::~CommandLinePlugInInfo(&plugIn);
  }
  return;
}

Assistant:

void 
CommandLineParser::readNonOptionCommands()
{
  if ( argumentStartsWith( ":" ) )
    m_testPath = getNextArgument().substr( 1 );
  else
  {
    CommandLinePlugInInfo plugIn;
    int indexParameter = getCurrentArgument().find( '=' );
    if ( indexParameter < 0 )
      plugIn.m_fileName = getCurrentArgument();
    else
    {
      plugIn.m_fileName = getCurrentArgument().substr( 0, indexParameter );
      std::string parameters = getCurrentArgument().substr( indexParameter +1 );
      plugIn.m_parameters = CPPUNIT_NS::PlugInParameters( parameters );
    }
    
    m_plugIns.push_back( plugIn );

    getNextArgument();
  }
}